

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O0

graphics_mode * get_graphics_mode(uint8_t id)

{
  graphics_mode *local_20;
  graphics_mode *test;
  uint8_t id_local;
  
  local_20 = graphics_modes;
  while( true ) {
    if (local_20 == (graphics_mode *)0x0) {
      return (graphics_mode *)0x0;
    }
    if (local_20->grafID == id) break;
    local_20 = local_20->pNext;
  }
  return local_20;
}

Assistant:

graphics_mode *get_graphics_mode(uint8_t id) {
	graphics_mode *test = graphics_modes;
	while (test) {
		if (test->grafID == id) {
			return test;
		}
		test = test->pNext;
	}
	return NULL;
}